

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

LClosure * luaY_parser(lua_State *L,ZIO *z,Mbuffer *buff,Dyndata *dyd,char *name,int firstchar)

{
  StkId pTVar1;
  LClosure *pLVar2;
  Table *pTVar3;
  Proto *pPVar4;
  Table *x__1;
  TValue *io_1;
  LClosure *x_;
  TValue *io;
  LClosure *cl;
  FuncState funcstate;
  LexState lexstate;
  int firstchar_local;
  char *name_local;
  Dyndata *dyd_local;
  Mbuffer *buff_local;
  ZIO *z_local;
  lua_State *L_local;
  
  pLVar2 = luaF_newLclosure(L,1);
  pTVar1 = L->top;
  (pTVar1->value_).gc = (GCObject *)pLVar2;
  pTVar1->tt_ = 0x46;
  luaD_inctop(L);
  pTVar3 = luaH_new(L);
  pTVar1 = L->top;
  (pTVar1->value_).gc = (GCObject *)pTVar3;
  pTVar1->tt_ = 0x45;
  luaD_inctop(L);
  cl = (LClosure *)luaF_newproto(L);
  pLVar2->p = (Proto *)cl;
  pPVar4 = (Proto *)luaS_new(L,name);
  cl[2].p = pPVar4;
  (dyd->label).n = 0;
  (dyd->gt).n = 0;
  (dyd->actvar).n = 0;
  luaX_setinput(L,(LexState *)&funcstate.nlocvars,z,(TString *)cl[2].p,firstchar);
  mainfunc((LexState *)&funcstate.nlocvars,(FuncState *)&cl);
  L->top = L->top + -1;
  return pLVar2;
}

Assistant:

LClosure *luaY_parser(lua_State *L, ZIO *z, Mbuffer *buff,
                      Dyndata *dyd, const char *name, int firstchar) {
    LexState lexstate;
    FuncState funcstate;
    LClosure *cl = luaF_newLclosure(L, 1);  /* create main closure */
    setclLvalue(L, L->top, cl);  /* anchor it (to avoid being collected) */
    luaD_inctop(L);
    lexstate.h = luaH_new(L);  /* create table for scanner */
    sethvalue(L, L->top, lexstate.h);  /* anchor it */
    luaD_inctop(L);
    funcstate.f = cl->p = luaF_newproto(L);
    funcstate.f->source = luaS_new(L, name);  /* create and anchor TString */
    lua_assert(iswhite(funcstate.f));  /* do not need barrier here */
    lexstate.buff = buff;
    lexstate.dyd = dyd;
    dyd->actvar.n = dyd->gt.n = dyd->label.n = 0;
    luaX_setinput(L, &lexstate, z, funcstate.f->source, firstchar);
    mainfunc(&lexstate, &funcstate);
    lua_assert(!funcstate.prev && funcstate.nups == 1 && !lexstate.fs);
    /* all scopes should be correctly finished */
    lua_assert(dyd->actvar.n == 0 && dyd->gt.n == 0 && dyd->label.n == 0);
    L->top--;  /* remove scanner's table */
    return cl;  /* closure is on the stack, too */
}